

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O0

char16 * Output::CaptureEnd(void)

{
  code *pcVar1;
  bool bVar2;
  byte *pbVar3;
  undefined4 *puVar4;
  undefined1 *puVar5;
  char16 *returnBuffer;
  
  pbVar3 = (byte *)__tls_get_addr(&PTR_01e57e60);
  if ((*pbVar3 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/Output.cpp"
                       ,0x28b,"(s_capture)","s_capture");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  puVar5 = (undefined1 *)__tls_get_addr(&PTR_01e57e60);
  *puVar5 = 0;
  return (char16 *)0x0;
}

Assistant:

char16 *
Output::CaptureEnd()
{
    Assert(s_capture);
    s_capture = false;
#ifdef _WIN32
    bufferFreeSize = 0;
    bufferAllocSize = 0;
    char16 * returnBuffer = buffer;
    buffer = nullptr;
#else
    char16 * returnBuffer = nullptr;
#endif

    return returnBuffer;
}